

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcPlateType::~IfcPlateType(IfcPlateType *this)

{
  ~IfcPlateType((IfcPlateType *)&this[-1].field_0x48);
  return;
}

Assistant:

IfcPlateType() : Object("IfcPlateType") {}